

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_helpers.cpp
# Opt level: O0

string * read_untill_delimiters_abi_cxx11_
                   (string *__return_storage_ptr__,ifstream *f,
                   vector<char,_std::allocator<char>_> *delimiters)

{
  bool bVar1;
  char cVar2;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_60 [3];
  int local_44;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_40;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_38;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_30;
  undefined1 local_21;
  vector<char,_std::allocator<char>_> *local_20;
  vector<char,_std::allocator<char>_> *delimiters_local;
  ifstream *f_local;
  string *ret_string;
  
  local_21 = 0;
  local_20 = delimiters;
  delimiters_local = (vector<char,_std::allocator<char>_> *)f;
  f_local = (ifstream *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  while( true ) {
    local_38._M_current = (char *)std::vector<char,_std::allocator<char>_>::begin(local_20);
    local_40._M_current = (char *)std::vector<char,_std::allocator<char>_>::end(local_20);
    local_44 = std::istream::peek();
    local_30 = std::
               find<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>,int>
                         (local_38,local_40,&local_44);
    local_60[0]._M_current = (char *)std::vector<char,_std::allocator<char>_>::end(local_20);
    bVar1 = __gnu_cxx::operator==(&local_30,local_60);
    if (!bVar1) break;
    cVar2 = std::istream::get();
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,cVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string read_untill_delimiters(std::ifstream &f,
                                   const std::vector<char> &delimiters) {
  std::string ret_string;
  while (std::find(delimiters.begin(), delimiters.end(), f.peek()) ==
         delimiters.end()) {
    ret_string += f.get();
  }
  return ret_string;
}